

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type_Error.h
# Opt level: O3

void __thiscall psy::C::ErrorType::~ErrorType(ErrorType *this)

{
  Type::~Type(&this->super_Type);
  operator_delete(this,0x10);
  return;
}

Assistant:

class PSY_C_API ErrorType final : public Type
{
public:
    //!@{
    /**
     * Cast \c this Type as an ErrorType.
     */
    virtual ErrorType* asErrorType() override { return this; }
    virtual const ErrorType* asErrorType() const override { return this; }
    //!@}

PSY_INTERNAL:
    PSY_GRANT_INTERNAL_ACCESS(Compilation);
    PSY_GRANT_INTERNAL_ACCESS(DeclarationBinder);
    PSY_GRANT_INTERNAL_ACCESS(TypeCanonicalizer);
    PSY_GRANT_INTERNAL_ACCESS(TypeChecker);

    ErrorType();
}